

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_spec.cpp
# Opt level: O2

void parseGPLFile(filebuf *file)

{
  bool bVar1;
  optional<Rgba> oVar2;
  undefined3 extraout_var;
  ushort uVar3;
  ushort i;
  string line;
  size_type n;
  ushort local_6c;
  string local_68;
  undefined8 local_48;
  vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_> *local_40;
  size_type local_38;
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  readLine(file,&local_68);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          starts_with(&local_68,"GIMP Palette");
  if (bVar1) {
    local_6c = (ushort)options.nbPalettes * (ushort)options.nbColorsPerPal;
    i = 0;
    local_40 = &options.palSpec;
    while( true ) {
      local_68._M_string_length = 0;
      *local_68._M_dataplus._M_p = '\0';
      readLine(file,&local_68);
      if (local_68._M_string_length == 0) break;
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              starts_with(&local_68,"#");
      if (!bVar1) {
        bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                starts_with(&local_68,"Name:");
        if (!bVar1) {
          bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  starts_with(&local_68,"Column:");
          if (!bVar1) {
            local_38 = 0;
            i = i + 1;
            oVar2 = parseColor(&local_68,&local_38,i);
            local_48 = CONCAT35(extraout_var,
                                oVar2.super__Optional_base<Rgba,_true,_true>._M_payload.
                                super__Optional_payload_base<Rgba>);
            if (((uint5)oVar2.super__Optional_base<Rgba,_true,_true>._M_payload.
                        super__Optional_payload_base<Rgba> & 0x100000000) == 0) goto LAB_0010bf96;
            if (i < local_6c) {
              uVar3 = i % (ushort)options.nbColorsPerPal;
              if (uVar3 == 1) {
                std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::
                emplace_back<>(local_40);
                uVar3 = i % (ushort)options.nbColorsPerPal;
              }
              options.palSpec.
              super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
              _M_impl.super__Vector_impl_data._M_finish[-1]._M_elems[uVar3] = SUB84(local_48,0);
            }
          }
        }
      }
    }
    if (local_6c < i) {
      warning("GPL file contains %u colors, but there can only be %u; ignoring extra",(ulong)i);
    }
  }
  else {
    error("Palette file does not appear to be a GPL palette file");
  }
LAB_0010bf96:
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

static void parseGPLFile(std::filebuf &file) {
	// https://gitlab.gnome.org/GNOME/gimp/-/blob/gimp-2-10/app/core/gimppalette-load.c#L39

	std::string line;
	readLine(file, line);
	if (!line.starts_with("GIMP Palette")) {
		error("Palette file does not appear to be a GPL palette file");
		return;
	}

	uint16_t nbColors = 0;
	uint16_t maxNbColors = options.nbColorsPerPal * options.nbPalettes;

	for (;;) {
		line.clear();
		readLine(file, line);
		if (!line.length()) {
			break;
		}

		if (line.starts_with("#") || line.starts_with("Name:") || line.starts_with("Column:")) {
			continue;
		}

		std::string::size_type n = 0;
		std::optional<Rgba> color = parseColor(line, n, nbColors + 1);
		if (!color) {
			return;
		}

		++nbColors;
		if (nbColors < maxNbColors) {
			if (nbColors % options.nbColorsPerPal == 1) {
				options.palSpec.emplace_back();
			}
			options.palSpec.back()[nbColors % options.nbColorsPerPal] = *color;
		}
	}

	if (nbColors > maxNbColors) {
		warning("GPL file contains %" PRIu16 " colors, but there can only be %" PRIu16
		        "; ignoring extra",
		        nbColors, maxNbColors);
	}
}